

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O1

size_t adl_metaMarkerCount(ADL_MIDIPlayer *device)

{
  return 0;
}

Assistant:

ADLMIDI_EXPORT size_t adl_metaMarkerCount(struct ADL_MIDIPlayer *device)
{
#ifndef ADLMIDI_DISABLE_MIDI_SEQUENCER
    if(!device)
        return 0;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    return play->m_sequencer->getMarkers().size();
#else
    ADL_UNUSED(device);
    return 0;
#endif
}